

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

uint8 * __thiscall
google::protobuf::EnumOptions::SerializeWithCachedSizesToArray(EnumOptions *this,uint8 *target)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  UninterpretedOption *this_00;
  uint8 *target_00;
  UnknownFieldSet *pUVar4;
  int local_a4;
  byte *pbStack_a0;
  int i;
  uint8 *target_local;
  EnumOptions *this_local;
  uint8 *local_28;
  byte *local_10;
  
  bVar1 = has_allow_alias(this);
  pbStack_a0 = target;
  if (bVar1) {
    bVar1 = allow_alias(this);
    uVar3 = internal::WireFormatLite::MakeTag(2,WIRETYPE_VARINT);
    if (uVar3 < 0x80) {
      *target = (byte)uVar3;
      local_28 = target + 1;
    }
    else if (uVar3 < 0x4000) {
      *target = (byte)uVar3 | 0x80;
      target[1] = (uint8)(uVar3 >> 7);
      local_28 = target + 2;
    }
    else {
      local_28 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,target);
    }
    pbStack_a0 = io::CodedOutputStream::WriteVarint32ToArray((uint)bVar1,local_28);
  }
  for (local_a4 = 0; iVar2 = uninterpreted_option_size(this), local_a4 < iVar2;
      local_a4 = local_a4 + 1) {
    this_00 = uninterpreted_option(this,local_a4);
    uVar3 = internal::WireFormatLite::MakeTag(999,WIRETYPE_LENGTH_DELIMITED);
    if (uVar3 < 0x80) {
      *pbStack_a0 = (byte)uVar3;
      local_10 = pbStack_a0 + 1;
    }
    else if (uVar3 < 0x4000) {
      *pbStack_a0 = (byte)uVar3 | 0x80;
      pbStack_a0[1] = (byte)(uVar3 >> 7);
      local_10 = pbStack_a0 + 2;
    }
    else {
      local_10 = io::CodedOutputStream::WriteVarint32FallbackToArray(uVar3,pbStack_a0);
    }
    uVar3 = UninterpretedOption::GetCachedSize(this_00);
    target_00 = io::CodedOutputStream::WriteVarint32ToArray(uVar3,local_10);
    pbStack_a0 = UninterpretedOption::SerializeWithCachedSizesToArray(this_00,target_00);
  }
  pbStack_a0 = internal::ExtensionSet::SerializeWithCachedSizesToArray
                         (&this->_extensions_,1000,0x20000000,pbStack_a0);
  pUVar4 = unknown_fields(this);
  bVar1 = UnknownFieldSet::empty(pUVar4);
  if (!bVar1) {
    pUVar4 = unknown_fields(this);
    pbStack_a0 = internal::WireFormat::SerializeUnknownFieldsToArray(pUVar4,pbStack_a0);
  }
  return pbStack_a0;
}

Assistant:

::google::protobuf::uint8* EnumOptions::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional bool allow_alias = 2 [default = true];
  if (has_allow_alias()) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(2, this->allow_alias(), target);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.SerializeWithCachedSizesToArray(
      1000, 536870912, target);

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}